

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::ResolveLanguageCompiler
          (cmGlobalGenerator *this,string *lang,cmMakefile *mf,bool optional)

{
  cmState *pcVar1;
  bool bVar2;
  char *pcVar3;
  string changeVars;
  string cnameString;
  string path;
  string langComp;
  string pathString;
  allocator local_e9;
  string local_e8;
  string local_c8;
  undefined1 local_a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  char local_78 [16];
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_68,"CMAKE_",(allocator *)local_88._M_local_buf);
  std::__cxx11::string::append((string *)&local_68);
  std::__cxx11::string::append((char *)&local_68);
  pcVar3 = cmMakefile::GetDefinition(mf,&local_68);
  if (pcVar3 == (char *)0x0) {
    if (!optional) {
      cmSystemTools::Error
                (local_68._M_dataplus._M_p," not set, after EnableLanguage",(char *)0x0,(char *)0x0)
      ;
    }
    goto LAB_002c90d1;
  }
  pcVar3 = cmMakefile::GetRequiredDefinition(mf,&local_68);
  local_88._M_allocated_capacity = (size_type)local_78;
  local_88._8_8_ = 0;
  local_78[0] = '\0';
  bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar3);
  if (bVar2) {
    std::__cxx11::string::assign(local_88._M_local_buf);
  }
  else {
    local_a8._0_8_ = (pointer)0x0;
    local_a8._8_8_ = (pointer)0x0;
    local_a8._16_8_ = (pointer)0x0;
    cmsys::SystemTools::FindProgram
              (&local_c8,pcVar3,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a8,false);
    std::__cxx11::string::operator=((string *)local_88._M_local_buf,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8);
  }
  if (local_88._8_8_ == 0) {
    if (optional) goto LAB_002c8ee8;
  }
  else {
    bVar2 = cmsys::SystemTools::FileExists((char *)local_88._M_allocated_capacity);
    if (bVar2 || optional) {
LAB_002c8ee8:
      pcVar3 = cmState::GetInitializedCacheValue(this->CMakeInstance->State,&local_68);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      if (pcVar3 != (char *)0x0 && !optional) {
        local_a8._0_8_ = local_a8 + 0x10;
        local_a8._8_8_ = (pointer)0x0;
        local_a8._16_8_ = local_a8._16_8_ & 0xffffffffffffff00;
        bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar3);
        if (bVar2) {
          std::__cxx11::string::assign(local_a8);
        }
        else {
          local_e8._M_dataplus._M_p = (pointer)0x0;
          local_e8._M_string_length = 0;
          local_e8.field_2._M_allocated_capacity = 0;
          cmsys::SystemTools::FindProgram
                    (&local_48,pcVar3,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_e8,false);
          std::__cxx11::string::operator=((string *)local_a8,(string *)&local_48);
          std::__cxx11::string::~string((string *)&local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_e8);
        }
        std::__cxx11::string::string((string *)&local_48,(string *)local_88._M_local_buf);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_a8);
        cmsys::SystemTools::ConvertToUnixSlashes(&local_48);
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_a8,&local_48);
        if (bVar2) {
          pcVar1 = this->CMakeInstance->State;
          std::__cxx11::string::string
                    ((string *)&local_e8,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_e9);
          pcVar3 = cmState::GetGlobalProperty(pcVar1,&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
          if (pcVar3 != (char *)0x0) {
            std::__cxx11::string::append((char *)&local_c8);
            std::__cxx11::string::append((char *)&local_c8);
          }
          std::__cxx11::string::append((string *)&local_c8);
          std::__cxx11::string::append((char *)&local_c8);
          std::__cxx11::string::append((char *)&local_c8);
          pcVar1 = this->CMakeInstance->State;
          std::__cxx11::string::string
                    ((string *)&local_e8,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_e9);
          cmState::SetGlobalProperty(pcVar1,&local_e8,local_c8._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_e8);
        }
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)local_a8);
      }
      std::__cxx11::string::~string((string *)&local_c8);
    }
  }
  std::__cxx11::string::~string((string *)local_88._M_local_buf);
LAB_002c90d1:
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void cmGlobalGenerator::ResolveLanguageCompiler(const std::string &lang,
                                                cmMakefile *mf,
                                                bool optional) const
{
  std::string langComp = "CMAKE_";
  langComp += lang;
  langComp += "_COMPILER";

  if(!mf->GetDefinition(langComp))
    {
    if(!optional)
      {
      cmSystemTools::Error(langComp.c_str(),
                           " not set, after EnableLanguage");
      }
    return;
    }
  const char* name = mf->GetRequiredDefinition(langComp);
  std::string path;
  if(!cmSystemTools::FileIsFullPath(name))
    {
    path = cmSystemTools::FindProgram(name);
    }
  else
    {
    path = name;
    }
  if((path.empty() || !cmSystemTools::FileExists(path.c_str()))
      && (optional==false))
    {
    return;
    }
  const char* cname = this->GetCMakeInstance()->
    GetState()->GetInitializedCacheValue(langComp);
  std::string changeVars;
  if(cname && !optional)
    {
    std::string cnameString;
    if(!cmSystemTools::FileIsFullPath(cname))
      {
      cnameString = cmSystemTools::FindProgram(cname);
      }
    else
      {
      cnameString = cname;
      }
    std::string pathString = path;
    // get rid of potentially multiple slashes:
    cmSystemTools::ConvertToUnixSlashes(cnameString);
    cmSystemTools::ConvertToUnixSlashes(pathString);
    if (cnameString != pathString)
      {
      const char* cvars =
        this->GetCMakeInstance()->GetState()->GetGlobalProperty(
          "__CMAKE_DELETE_CACHE_CHANGE_VARS_");
      if(cvars)
        {
        changeVars += cvars;
        changeVars += ";";
        }
      changeVars += langComp;
      changeVars += ";";
      changeVars += cname;
      this->GetCMakeInstance()->GetState()->SetGlobalProperty(
        "__CMAKE_DELETE_CACHE_CHANGE_VARS_",
        changeVars.c_str());
      }
    }
}